

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tri_dquality_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *d_quality_local;
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if (ref_node->tri_quality == 1) {
    uVar1 = ref_node_tri_epic_dquality_dnode0(ref_node,nodes,quality,d_quality);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x89f,
             "ref_node_tri_dquality_dnode0",(ulong)uVar1,"epic");
      return uVar1;
    }
  }
  else {
    if (ref_node->tri_quality != 2) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8a6,
             "ref_node_tri_dquality_dnode0","case not recognized");
      return 1;
    }
    uVar1 = ref_node_tri_jac_dquality_dnode0(ref_node,nodes,quality,d_quality);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8a3,
             "ref_node_tri_dquality_dnode0",(ulong)uVar1,"epic");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_dquality_dnode0(REF_NODE ref_node,
                                                REF_INT *nodes,
                                                REF_DBL *quality,
                                                REF_DBL *d_quality) {
  switch (ref_node->tri_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tri_epic_dquality_dnode0(ref_node, nodes, quality,
                                            d_quality),
          "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tri_jac_dquality_dnode0(ref_node, nodes, quality, d_quality),
          "epic");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}